

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::MpMap<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  NodeBase *mem;
  uint uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  MessageLite *prototype_for_func;
  ThreadSafeArena *this;
  uint uVar4;
  void *pvVar5;
  NodeBase *pNVar6;
  char *pcVar7;
  uint *puVar8;
  byte bVar9;
  MapFieldBaseForParse *target;
  UntypedMapBase *this_00;
  byte local_6c;
  
  puVar8 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar8 & 3) != 0) {
    AlignFail(puVar8);
  }
  uVar4 = puVar8[2];
  uVar1 = table->aux_offset;
  uVar2 = *(ulong *)((long)&table->has_bits_offset + (ulong)(ushort)uVar4 * 8 + (ulong)uVar1);
  if ((((uint)uVar2 >> 0x10 & 1) == 0) || ((data.field_0._0_4_ & 7) != 2)) {
    pcVar7 = MpFallback(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  pvVar5 = MaybeGetSplitBase(msg,true,table);
  this_00 = (UntypedMapBase *)((ulong)*puVar8 + (long)pvVar5);
  if ((uVar2 >> 0x10 & 2) == 0) {
    if (((ulong)this_00 & 7) != 0) {
LAB_00299443:
      AlignFail(this_00);
    }
    this_00 = (UntypedMapBase *)(*(code *)**(undefined8 **)this_00)(this_00,1);
  }
  else if (((ulong)this_00 & 7) != 0) goto LAB_00299443;
  bVar9 = (byte)((uVar2 & 0xffffffff) >> 3) & 7;
  local_6c = (byte)(uVar2 >> 0xb) & 7;
  pNVar6 = UntypedMapBase::AllocNode(this_00,uVar2 >> 0x30);
  if (bVar9 < 5) {
    mem = pNVar6 + 1;
    switch(bVar9) {
    case 0:
      *(undefined1 *)&mem->next = 0;
      break;
    case 1:
      *(undefined4 *)&mem->next = 0;
      break;
    case 2:
      mem->next = (NodeBase *)0x0;
      break;
    case 3:
      this = &((this_00->alloc_).arena_)->impl_;
      pNVar6[1].next = pNVar6 + 3;
      pNVar6[2].next = (NodeBase *)0x0;
      *(undefined1 *)&pNVar6[3].next = 0;
      if (this != (ThreadSafeArena *)0x0) {
        ThreadSafeArena::AddCleanup(this,mem,cleanup::arena_destruct_object<std::__cxx11::string>);
      }
      break;
    case 4:
      puVar3 = *(undefined8 **)
                (*(long *)(&table->fast_idx_mask + (ulong)(ushort)uVar4 * 8 + (ulong)uVar1) + 0x20);
      prototype_for_func = (MessageLite *)*puVar3;
      MessageCreator::PlacementNew<false,google::protobuf::MessageLite>
                ((MessageCreator *)(puVar3 + 5),prototype_for_func,prototype_for_func,mem,
                 (this_00->alloc_).arena_);
    }
    if (local_6c < 5) {
      pcVar7 = (char *)(*(code *)(&DAT_003cafd4 + *(int *)(&DAT_003cafd4 + (uVar2 >> 0xb & 7) * 4)))
                                 ();
      return pcVar7;
    }
  }
  Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
              ,0x9e9);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpMap(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  // `aux[0]` points into a MapAuxInfo.
  // If we have a message mapped_type aux[1] points into a `create_in_arena`.
  // If we have a validated enum mapped_type aux[1] point into a
  // `enum_data`.
  const auto* aux = table->field_aux(&entry);
  const auto map_info = aux[0].map_info;

  if (PROTOBUF_PREDICT_FALSE(!map_info.is_supported ||
                             (data.tag() & 7) !=
                                 WireFormatLite::WIRETYPE_LENGTH_DELIMITED)) {
    PROTOBUF_MUSTTAIL return MpFallback(PROTOBUF_TC_PARAM_PASS);
  }

  // When using LITE, the offset points directly into the Map<> object.
  // Otherwise, it points into a MapField and we must synchronize with
  // reflection. It is done by calling the MutableMap() virtual function on the
  // field's base class.
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  UntypedMapBase& map =
      map_info.use_lite
          ? RefAt<UntypedMapBase>(base, entry.offset)
          : *RefAt<MapFieldBaseForParse>(base, entry.offset).MutableMap();

  const uint32_t saved_tag = data.tag();

  while (true) {
    NodeBase* node = map.AllocNode(map_info.node_size_info);

    InitializeMapNodeEntry(node->GetVoidKey(), map_info.key_type_card, map, aux,
                           true);
    InitializeMapNodeEntry(node->GetVoidValue(map_info.node_size_info),
                           map_info.value_type_card, map, aux, false);

    ptr = ctx->ParseLengthDelimitedInlined(ptr, [&](const char* ptr) {
      return ParseOneMapEntry(node, ptr, ctx, aux, table, entry, map.arena());
    });

    if (PROTOBUF_PREDICT_TRUE(ptr != nullptr)) {
      if (PROTOBUF_PREDICT_FALSE(map_info.value_is_validated_enum &&
                                 !internal::ValidateEnumInlined(
                                     *static_cast<int32_t*>(node->GetVoidValue(
                                         map_info.node_size_info)),
                                     aux[1].enum_data))) {
        WriteMapEntryAsUnknown(msg, table, saved_tag, node, map_info);
      } else {
        // Done parsing the node, try to insert it.
        // If it overwrites something we get old node back to destroy it.
        switch (map_info.key_type_card.cpp_type()) {
          case MapTypeCard::kBool:
            node = static_cast<KeyMapBase<bool>&>(map).InsertOrReplaceNode(
                static_cast<KeyMapBase<bool>::KeyNode*>(node));
            break;
          case MapTypeCard::k32:
            node = static_cast<KeyMapBase<uint32_t>&>(map).InsertOrReplaceNode(
                static_cast<KeyMapBase<uint32_t>::KeyNode*>(node));
            break;
          case MapTypeCard::k64:
            node = static_cast<KeyMapBase<uint64_t>&>(map).InsertOrReplaceNode(
                static_cast<KeyMapBase<uint64_t>::KeyNode*>(node));
            break;
          case MapTypeCard::kString:
            node =
                static_cast<KeyMapBase<std::string>&>(map).InsertOrReplaceNode(
                    static_cast<KeyMapBase<std::string>::KeyNode*>(node));
            break;
          default:
            Unreachable();
        }
      }
    }

    // Destroy the node if we have it.
    // It could be because we failed to parse, or because insertion returned
    // an overwritten node.
    if (PROTOBUF_PREDICT_FALSE(node != nullptr && map.arena() == nullptr)) {
      DestroyMapNode(node, map_info, map);
    }

    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) {
      PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
    }

    if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) {
      PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
    }

    uint32_t next_tag;
    const char* ptr2 = ReadTagInlined(ptr, &next_tag);
    if (next_tag != saved_tag) break;
    ptr = ptr2;
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}